

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_style_push_font(nk_context *ctx,nk_user_font *font)

{
  int iVar1;
  nk_config_stack_user_font *pnVar2;
  nk_config_stack_user_font_element *pnVar3;
  nk_config_stack_user_font_element *element;
  nk_config_stack_user_font *font_stack;
  nk_user_font *font_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x42b8,"int nk_style_push_font(struct nk_context *, const struct nk_user_font *)"
                 );
  }
  if (ctx == (nk_context *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    pnVar2 = &(ctx->stacks).fonts;
    if (7 < pnVar2->head) {
      __assert_fail("font_stack->head < (int)(sizeof(font_stack->elements)/sizeof(font_stack->elements)[0])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x42bc,
                    "int nk_style_push_font(struct nk_context *, const struct nk_user_font *)");
    }
    if (pnVar2->head < 8) {
      iVar1 = pnVar2->head;
      pnVar2->head = iVar1 + 1;
      pnVar3 = (ctx->stacks).fonts.elements + iVar1;
      pnVar3->address = &(ctx->style).font;
      pnVar3->old_value = (ctx->style).font;
      (ctx->style).font = font;
      ctx_local._4_4_ = 1;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_style_push_font(struct nk_context *ctx, const struct nk_user_font *font)
{
    struct nk_config_stack_user_font *font_stack;
    struct nk_config_stack_user_font_element *element;

    NK_ASSERT(ctx);
    if (!ctx) return 0;

    font_stack = &ctx->stacks.fonts;
    NK_ASSERT(font_stack->head < (int)NK_LEN(font_stack->elements));
    if (font_stack->head >= (int)NK_LEN(font_stack->elements))
        return 0;

    element = &font_stack->elements[font_stack->head++];
    element->address = &ctx->style.font;
    element->old_value = ctx->style.font;
    ctx->style.font = font;
    return 1;
}